

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void OCSBtest(double *x,int N,int f,int mlags,char *method,double *statistics,double *critical)

{
  int iVar1;
  void *__ptr;
  double *icvals_00;
  reg_object prVar2;
  void *__ptr_00;
  double dVar3;
  reg_object *local_68;
  reg_object crit_reg;
  reg_object *list;
  reg_object fit;
  double *icvals;
  double *tval;
  int maxlag;
  int allnans;
  int bestindex;
  int i;
  double *statistics_local;
  char *method_local;
  int mlags_local;
  int f_local;
  int N_local;
  double *x_local;
  
  __ptr = malloc((long)mlags << 3);
  local_68 = (reg_object *)0x0;
  icvals_00 = (double *)malloc((long)mlags << 3);
  tval._0_4_ = mlags;
  if (0 < mlags) {
    iVar1 = strcmp(method,"fixed");
    if (iVar1 != 0) {
      for (allnans = 1; allnans <= mlags; allnans = allnans + 1) {
        prVar2 = fitOCSB(x,N,f,allnans,mlags);
        *(reg_object *)((long)__ptr + (long)(allnans + -1) * 8) = prVar2;
        dVar3 = getCVal(*(reg_object *)((long)__ptr + (long)(allnans + -1) * 8),method);
        icvals_00[allnans + -1] = dVar3;
      }
      iVar1 = checkAllNans(icvals_00,mlags);
      if (iVar1 == 1) {
        printf(
              "All lag values up to \'maxlag\' produced singular matrices. Use different method. \n"
              );
        exit(-1);
      }
      iVar1 = getBestIndex(icvals_00,mlags);
      tval._0_4_ = iVar1 + -1;
      local_68 = *(reg_object **)((long)__ptr + (long)iVar1 * 8);
    }
  }
  list = (reg_object *)fitOCSB(x,N,f,(int)tval,(int)tval);
  if ((((reg_object)list)->rank != ((reg_object)list)->p) &&
     (((reg_object)list)->rank == ((reg_object)list)->rank)) {
    if (local_68 == (reg_object *)0x0) {
      printf("Could not find a solution. Try a different method. \n");
      exit(-1);
    }
    list = local_68;
  }
  __ptr_00 = malloc((long)*(int *)((long)list + 4) << 3);
  for (allnans = 0; allnans < *(int *)((long)list + 4); allnans = allnans + 1) {
    *(double *)((long)__ptr_00 + (long)allnans * 8) =
         (double)list[(long)allnans * 4 + 0x16] / (double)list[(long)allnans * 4 + 0x19];
  }
  for (allnans = 0; allnans < mlags; allnans = allnans + 1) {
    free_reg(*(reg_object *)((long)__ptr + (long)allnans * 8));
  }
  dVar3 = calcOCSBCritVal(f);
  *critical = dVar3;
  *statistics = *(double *)((long)__ptr_00 + (long)(*(int *)((long)list + 4) + -1) * 8);
  free(__ptr);
  free(icvals_00);
  free(__ptr_00);
  return;
}

Assistant:

void OCSBtest(double *x, int N, int f, int mlags, const char *method,double *statistics,double *critical) {
    int i, bestindex,allnans,maxlag;
    double *tval,*icvals;
    reg_object fit;
    reg_object *list = (reg_object*)malloc(sizeof(reg_object)*mlags);
    reg_object crit_reg = NULL;

    icvals = (double*) malloc(sizeof(double)*mlags);

    maxlag = mlags;
    if (mlags > 0 && strcmp(method,"fixed")) {

        for(i = 1; i <= mlags;++i) {
            list[i-1] = fitOCSB(x,N,f,i,mlags);
            icvals[i-1] = getCVal(list[i-1],method);
            //printf("icvals %g",icvals[i-1]);
        }

        allnans = checkAllNans(icvals,mlags);

        if (allnans == 1) {
            printf("All lag values up to 'maxlag' produced singular matrices. Use different method. \n");
            exit(-1);
        }

        bestindex = getBestIndex(icvals,mlags);
        maxlag = bestindex-1;
        crit_reg = list[bestindex];

    }

    /* if (maxlag <= 0) {
        fit = crit_reg;
    } else {
        fit = fitOCSB(x,N,f,maxlag,maxlag);

        if (fit->rank != fit->p && fit->rank == fit->rank) {
            if (crit_reg == NULL) {
                printf("Could not find a solution. Try a different method. \n");
                exit(-1);
            } else {
                fit = crit_reg;
            }
        }
    } */

    fit = fitOCSB(x,N,f,maxlag,maxlag);

    //printf("\n\n%d\n\n",fit->rank);

    if (fit->rank != fit->p && fit->rank == fit->rank) {
        if (crit_reg == NULL) {
            printf("Could not find a solution. Try a different method. \n");
            exit(-1);
        } else {
            fit = crit_reg;
        }
    }

    tval = (double*) malloc(sizeof(double)*fit->p);

    for(i = 0; i < fit->p; ++i) {
		tval[i] = (fit->beta+i)->value/(fit->beta+i)->stdErr;
	}

    //mdisplay(tval,1,fit->p);

    for(i = 0; i < mlags;++i) {
		free_reg(list[i]);
    }

    *critical = calcOCSBCritVal(f);
    *statistics = tval[fit->p-1];

    free(list);
    free(icvals);
    free(tval);
}